

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPath.c
# Opt level: O0

void Abc_GraphDeriveGiaDump(Vec_Wec_t *vNodes,Vec_Int_t *vEdges,int Size)

{
  Gia_Man_t *pInit;
  Gia_Man_t *pGia;
  char pFileName [100];
  int Size_local;
  Vec_Int_t *vEdges_local;
  Vec_Wec_t *vNodes_local;
  
  pInit = Abc_GraphDeriveGia(vNodes,vEdges);
  Vec_IntSize(vEdges);
  sprintf((char *)&pGia,"grid_%dx%d_e%03d.aig",(ulong)(uint)Size,(ulong)(uint)Size);
  Gia_AigerWrite(pInit,(char *)&pGia,0,0,0);
  Gia_ManStop(pInit);
  printf("Finished dumping AIG into file \"%s\".\n",&pGia);
  return;
}

Assistant:

void Abc_GraphDeriveGiaDump( Vec_Wec_t * vNodes, Vec_Int_t * vEdges, int Size )
{
    char pFileName[100];
    Gia_Man_t * pGia = Abc_GraphDeriveGia( vNodes, vEdges );
    sprintf( pFileName, "grid_%dx%d_e%03d.aig", Size, Size, Vec_IntSize(vEdges)/2 );
    Gia_AigerWrite( pGia, pFileName, 0, 0, 0 );
    Gia_ManStop( pGia );
    printf( "Finished dumping AIG into file \"%s\".\n", pFileName );
}